

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_close_session(tclpkcs11_handle *handle)

{
  CK_RV CVar1;
  CK_RV chk_rv;
  tclpkcs11_handle *handle_local;
  
  if (handle->session_active != 0) {
    handle->session_active = 0;
    CVar1 = (*handle->pkcs11->C_CloseSession)(handle->session);
    if (CVar1 != 0) {
      return (int)CVar1;
    }
  }
  return 0;
}

Assistant:

MODULE_SCOPE int tclpkcs11_close_session(struct tclpkcs11_handle *handle) {
  CK_RV chk_rv;

  if (handle->session_active) {
    handle->session_active = 0;
    chk_rv = handle->pkcs11->C_CloseSession(handle->session);

    if (chk_rv != CKR_OK) {
      return(chk_rv);
    }
  }

  return(CKR_OK);
}